

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void setmnotwielded(monst *mon,obj *obj)

{
  boolean bVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  obj *obj_local;
  monst *mon_local;
  
  if (obj == (obj *)0x0) {
    return;
  }
  bVar1 = artifact_light(obj);
  if ((bVar1 == '\0') || ((*(uint *)&obj->field_0x4a >> 0x13 & 1) == 0)) goto LAB_0033667e;
  end_burn(obj,'\0');
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mon->data->mflags3 & 0x200) == 0)))) goto LAB_0033667e;
      bVar2 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x00336578;
    }
  }
  else {
    bVar2 = worm_known(level,mon);
joined_r0x00336578:
    if (bVar2 == 0) goto LAB_0033667e;
  }
  if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)) &&
      (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
    pcVar3 = xname(obj);
    pcVar3 = The(pcVar3);
    pcVar4 = mon_nam(mon);
    pcVar4 = s_suffix(pcVar4);
    pcVar5 = mbodypart(mon,6);
    pcVar6 = otense(obj,"stop");
    pline("%s in %s %s %s glowing.",pcVar3,pcVar4,pcVar5,pcVar6);
  }
LAB_0033667e:
  obj->owornmask = obj->owornmask & 0xfffffeff;
  return;
}

Assistant:

void setmnotwielded(struct monst *mon, struct obj *obj)
{
    if (!obj) return;
    if (artifact_light(obj) && obj->lamplit) {
	end_burn(obj, FALSE);
	if (canseemon(level, mon))
	    pline("%s in %s %s %s glowing.", The(xname(obj)),
		  s_suffix(mon_nam(mon)), mbodypart(mon,HAND),
		  otense(obj, "stop"));
    }
    obj->owornmask &= ~W_WEP;
}